

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O2

int ffgicsa(fitsfile *fptr,char version,double *xrval,double *yrval,double *xrpix,double *yrpix,
           double *xinc,double *yinc,double *rot,char *type,int *status)

{
  fitsfile *pfVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  char alt [2];
  int tstat;
  fitsfile *local_128;
  double local_120;
  double local_118;
  double cd22;
  double cd11;
  double *local_100;
  double pc12;
  double pc22;
  double pc21;
  double pc11;
  double cd12;
  double cd21;
  char keyname [71];
  char ctype [71];
  
  tstat = 0;
  cd11 = 0.0;
  cd21 = 0.0;
  cd22 = 0.0;
  cd12 = 0.0;
  pc21 = 0.0;
  pc12 = 0.0;
  pc11 = 1.0;
  pc22 = 1.0;
  if (0 < *status) {
    return *status;
  }
  if (version == ' ') {
    ffgics(fptr,xrval,yrval,xrpix,yrpix,xinc,yinc,rot,type,status);
    return *status;
  }
  if ((byte)(version + 0xa5U) < 0xe6) {
    ffpmsg("ffgicsa: illegal WCS version code (must be A - Z or blank)");
    *status = 0x1f7;
    return 0x1f7;
  }
  tstat = 0;
  alt[1] = '\0';
  builtin_strncpy(keyname,"CRVAL1",7);
  alt[0] = version;
  local_100 = yrval;
  strcat(keyname,alt);
  local_128 = fptr;
  iVar3 = ffgkyd(fptr,keyname,xrval,(char *)0x0,&tstat);
  if (iVar3 != 0) {
    *xrval = 0.0;
  }
  tstat = 0;
  builtin_strncpy(keyname,"CRVAL2",7);
  strcat(keyname,alt);
  pdVar2 = local_100;
  iVar3 = ffgkyd(local_128,keyname,local_100,(char *)0x0,&tstat);
  if (iVar3 != 0) {
    *pdVar2 = 0.0;
  }
  tstat = 0;
  builtin_strncpy(keyname,"CRPIX1",7);
  strcat(keyname,alt);
  iVar3 = ffgkyd(local_128,keyname,xrpix,(char *)0x0,&tstat);
  if (iVar3 != 0) {
    *xrpix = 0.0;
  }
  tstat = 0;
  builtin_strncpy(keyname,"CRPIX2",7);
  strcat(keyname,alt);
  iVar3 = ffgkyd(local_128,keyname,yrpix,(char *)0x0,&tstat);
  if (iVar3 != 0) {
    *yrpix = 0.0;
  }
  tstat = 0;
  builtin_strncpy(keyname,"CDELT1",7);
  strcat(keyname,alt);
  pfVar1 = local_128;
  iVar3 = ffgkyd(local_128,keyname,xinc,(char *)0x0,&tstat);
  if (iVar3 == 0) {
    builtin_strncpy(keyname,"CDELT2",7);
    strcat(keyname,alt);
    iVar3 = ffgkyd(pfVar1,keyname,yinc,(char *)0x0,&tstat);
    if (iVar3 != 0) {
      *yinc = 1.0;
    }
    tstat = 0;
    builtin_strncpy(keyname,"CROTA2",7);
    strcat(keyname,alt);
    iVar3 = ffgkyd(local_128,keyname,rot,(char *)0x0,&tstat);
    if (iVar3 == 0) goto LAB_001b3345;
    *rot = 0.0;
    tstat = 0;
    builtin_strncpy(keyname,"PC1_1",6);
    strcat(keyname,alt);
    iVar3 = ffgkyd(local_128,keyname,&pc11,(char *)0x0,&tstat);
    if (iVar3 != 0) {
      tstat = 0;
    }
    builtin_strncpy(keyname,"PC2_1",6);
    strcat(keyname,alt);
    iVar4 = ffgkyd(local_128,keyname,&pc21,(char *)0x0,&tstat);
    if (iVar4 != 0) {
      tstat = 0;
    }
    builtin_strncpy(keyname,"PC1_2",6);
    strcat(keyname,alt);
    iVar5 = ffgkyd(local_128,keyname,&pc12,(char *)0x0,&tstat);
    if (iVar5 != 0) {
      tstat = 0;
    }
    builtin_strncpy(keyname,"PC2_2",6);
    strcat(keyname,alt);
    iVar6 = ffgkyd(local_128,keyname,&pc22,(char *)0x0,&tstat);
    if (iVar6 != 0 && (iVar5 != 0 && (iVar4 != 0 && iVar3 != 0))) goto LAB_001b3345;
    local_120 = atan2(pc21,pc11);
    dVar8 = atan2(-pc12,pc22);
    dVar9 = local_120;
    if (dVar8 <= local_120) {
      dVar9 = dVar8;
    }
    dVar10 = local_120;
    if (local_120 <= dVar8) {
      dVar10 = dVar8;
    }
    uVar7 = -(ulong)(1.5707963267948966 < dVar10 - dVar9);
    dVar9 = (double)(~uVar7 & (ulong)dVar9 | (ulong)(dVar9 + 3.141592653589793) & uVar7);
    if (0.0002 < ABS(dVar9 - dVar10)) {
      *status = 0x1fa;
    }
    dVar9 = ((dVar10 + dVar9) * 0.5 * 180.0) / 3.141592653589793;
  }
  else {
    tstat = 0;
    builtin_strncpy(keyname,"CD1_1",6);
    strcat(keyname,alt);
    iVar3 = ffgkyd(pfVar1,keyname,&cd11,(char *)0x0,&tstat);
    if (iVar3 != 0) {
      tstat = 0;
    }
    builtin_strncpy(keyname,"CD2_1",6);
    strcat(keyname,alt);
    iVar4 = ffgkyd(pfVar1,keyname,&cd21,(char *)0x0,&tstat);
    if (iVar4 != 0) {
      tstat = 0;
    }
    builtin_strncpy(keyname,"CD1_2",6);
    strcat(keyname,alt);
    iVar5 = ffgkyd(local_128,keyname,&cd12,(char *)0x0,&tstat);
    if (iVar5 != 0) {
      tstat = 0;
    }
    builtin_strncpy(keyname,"CD2_2",6);
    strcat(keyname,alt);
    pfVar1 = local_128;
    iVar6 = ffgkyd(local_128,keyname,&cd22,(char *)0x0,&tstat);
    if (iVar6 != 0 && (iVar5 != 0 && (iVar4 != 0 && iVar3 != 0))) {
      *xinc = 1.0;
      tstat = 0;
      builtin_strncpy(keyname,"CDELT2",7);
      strcat(keyname,alt);
      iVar3 = ffgkyd(pfVar1,keyname,yinc,(char *)0x0,&tstat);
      if (iVar3 != 0) {
        *yinc = 1.0;
      }
      tstat = 0;
      builtin_strncpy(keyname,"CROTA2",7);
      strcat(keyname,alt);
      iVar3 = ffgkyd(local_128,keyname,rot,(char *)0x0,&tstat);
      dVar9 = 0.0;
      if (iVar3 == 0) goto LAB_001b3345;
    }
    else {
      local_120 = atan2(cd21,cd11);
      dVar8 = atan2(-cd12,cd22);
      dVar9 = local_120;
      if (dVar8 <= local_120) {
        dVar9 = dVar8;
      }
      if (local_120 <= dVar8) {
        local_120 = dVar8;
      }
      uVar7 = -(ulong)(1.5707963267948966 < local_120 - dVar9);
      dVar9 = (double)(~uVar7 & (ulong)dVar9 | (ulong)(dVar9 + 3.141592653589793) & uVar7);
      if (0.0002 < ABS(dVar9 - local_120)) {
        *status = 0x1fa;
      }
      local_120 = (local_120 + dVar9) * 0.5;
      local_118 = cd11;
      dVar9 = cos(local_120);
      *xinc = local_118 / dVar9;
      local_118 = cd22;
      dVar9 = cos(local_120);
      *yinc = local_118 / dVar9;
      *rot = (local_120 * 180.0) / 3.141592653589793;
      if (0.0 < *yinc || *yinc == 0.0) goto LAB_001b3345;
      *xinc = -*xinc;
      *yinc = -*yinc;
      dVar9 = *rot + -180.0;
    }
  }
  *rot = dVar9;
LAB_001b3345:
  tstat = 0;
  builtin_strncpy(keyname,"CTYPE1",7);
  strcat(keyname,alt);
  iVar3 = ffgkys(local_128,keyname,ctype,(char *)0x0,&tstat);
  if (iVar3 == 0) {
    strncpy(type,ctype + 4,4);
    type[4] = '\0';
    if ((ctype._0_4_ == 0x2d434544) || (iVar3 = bcmp(ctype + 1,"LAT",3), iVar3 == 0)) {
      *rot = 90.0 - *rot;
      *yinc = -*yinc;
      dVar9 = *xrval;
      *xrval = *local_100;
      *local_100 = dVar9;
    }
  }
  else {
    *type = '\0';
  }
  return *status;
}

Assistant:

int ffgicsa(fitsfile *fptr,    /* I - FITS file pointer           */
           char version,      /* I - character code of desired version */
	                      /*     A - Z or blank */
           double *xrval,     /* O - X reference value           */
           double *yrval,     /* O - Y reference value           */
           double *xrpix,     /* O - X reference pixel           */
           double *yrpix,     /* O - Y reference pixel           */
           double *xinc,      /* O - X increment per pixel       */
           double *yinc,      /* O - Y increment per pixel       */
           double *rot,       /* O - rotation angle (degrees)    */
           char *type,        /* O - type of projection ('-tan') */
           int *status)       /* IO - error status               */
/*
       read the values of the celestial coordinate system keywords.
       These values may be used as input to the subroutines that
       calculate celestial coordinates. (ffxypx, ffwldp)

       Modified in Nov 1999 to convert the CD matrix keywords back
       to the old CDELTn form, and to swap the axes if the dec-like
       axis is given first, and to assume default values if any of the
       keywords are not present.
*/
{
    int tstat = 0, cd_exists = 0, pc_exists = 0;
    char ctype[FLEN_VALUE], keyname[FLEN_VALUE], alt[2];
    double cd11 = 0.0, cd21 = 0.0, cd22 = 0.0, cd12 = 0.0;
    double pc11 = 1.0, pc21 = 0.0, pc22 = 1.0, pc12 = 0.0;
    double pi =  3.1415926535897932;
    double phia, phib, temp;
    double toler = .0002;  /* tolerance for angles to agree (radians) */
                           /*   (= approximately 0.01 degrees) */

    if (*status > 0)
       return(*status);

    if (version == ' ') {
      ffgics(fptr, xrval, yrval, xrpix, yrpix, xinc, yinc, rot, type, status);
      return (*status);
    }

    if (version > 'Z' || version < 'A') {
      ffpmsg("ffgicsa: illegal WCS version code (must be A - Z or blank)");
      return(*status = WCS_ERROR);
    }

    alt[0] = version;
    alt[1] = '\0';
    
    tstat = 0;
    strcpy(keyname, "CRVAL1");
    strcat(keyname, alt);
    if (ffgkyd(fptr, keyname, xrval, NULL, &tstat))
       *xrval = 0.;

    tstat = 0;
    strcpy(keyname, "CRVAL2");
    strcat(keyname, alt);
    if (ffgkyd(fptr, keyname, yrval, NULL, &tstat))
       *yrval = 0.;

    tstat = 0;
    strcpy(keyname, "CRPIX1");
    strcat(keyname, alt);
    if (ffgkyd(fptr, keyname, xrpix, NULL, &tstat))
        *xrpix = 0.;

    tstat = 0;
    strcpy(keyname, "CRPIX2");
    strcat(keyname, alt);
     if (ffgkyd(fptr, keyname, yrpix, NULL, &tstat))
        *yrpix = 0.;

    /* look for CDELTn first, then CDi_j keywords */
    tstat = 0;
    strcpy(keyname, "CDELT1");
    strcat(keyname, alt);
    if (ffgkyd(fptr, keyname, xinc, NULL, &tstat))
    {
        /* CASE 1: no CDELTn keyword, so look for the CD matrix */
        tstat = 0;
        strcpy(keyname, "CD1_1");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, &cd11, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        strcpy(keyname, "CD2_1");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, &cd21, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        strcpy(keyname, "CD1_2");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, &cd12, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        strcpy(keyname, "CD2_2");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, &cd22, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        if (cd_exists)  /* convert CDi_j back to CDELTn */
        {
            /* there are 2 ways to compute the angle: */
            phia = atan2( cd21, cd11);
            phib = atan2(-cd12, cd22);

            /* ensure that phia <= phib */
            temp = minvalue(phia, phib);
            phib = maxvalue(phia, phib);
            phia = temp;

            /* there is a possible 180 degree ambiguity in the angles */
            /* so add 180 degress to the smaller value if the values  */
            /* differ by more than 90 degrees = pi/2 radians.         */
            /* (Later, we may decide to take the other solution by    */
            /* subtracting 180 degrees from the larger value).        */

            if ((phib - phia) > (pi / 2.))
               phia += pi;

            if (fabs(phia - phib) > toler) 
            {
               /* angles don't agree, so looks like there is some skewness */
               /* between the axes.  Return with an error to be safe. */
               *status = APPROX_WCS_KEY;
            }
      
            phia = (phia + phib) /2.;  /* use the average of the 2 values */
            *xinc = cd11 / cos(phia);
            *yinc = cd22 / cos(phia);
            *rot = phia * 180. / pi;

            /* common usage is to have a positive yinc value.  If it is */
            /* negative, then subtract 180 degrees from rot and negate  */
            /* both xinc and yinc.  */

            if (*yinc < 0)
            {
                *xinc = -(*xinc);
                *yinc = -(*yinc);
                *rot = *rot - 180.;
            }
        }
        else   /* no CD matrix keywords either */
        {
            *xinc = 1.;

            /* there was no CDELT1 keyword, but check for CDELT2 just in case */
            tstat = 0;
            strcpy(keyname, "CDELT2");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, yinc, NULL, &tstat))
                *yinc = 1.;

            tstat = 0;
            strcpy(keyname, "CROTA2");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, rot, NULL, &tstat))
                *rot=0.;
        }
    }
    else  /* Case 2: CDELTn + optional PC matrix */
    {
        strcpy(keyname, "CDELT2");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, yinc, NULL, &tstat))
            *yinc = 1.;

        tstat = 0;
        strcpy(keyname, "CROTA2");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, rot, NULL, &tstat))
        {
            *rot=0.;

            /* no CROTA2 keyword, so look for the PC matrix */
            tstat = 0;
            strcpy(keyname, "PC1_1");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, &pc11, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            strcpy(keyname, "PC2_1");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, &pc21, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            strcpy(keyname, "PC1_2");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, &pc12, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            strcpy(keyname, "PC2_2");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, &pc22, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            if (pc_exists)  /* convert PCi_j back to CDELTn */
            {
                /* there are 2 ways to compute the angle: */
                phia = atan2( pc21, pc11);
                phib = atan2(-pc12, pc22);

                /* ensure that phia <= phib */
                temp = minvalue(phia, phib);
                phib = maxvalue(phia, phib);
                phia = temp;

                /* there is a possible 180 degree ambiguity in the angles */
                /* so add 180 degress to the smaller value if the values  */
                /* differ by more than 90 degrees = pi/2 radians.         */
                /* (Later, we may decide to take the other solution by    */
                /* subtracting 180 degrees from the larger value).        */

                if ((phib - phia) > (pi / 2.))
                   phia += pi;

                if (fabs(phia - phib) > toler) 
                {
                  /* angles don't agree, so looks like there is some skewness */
                  /* between the axes.  Return with an error to be safe. */
                  *status = APPROX_WCS_KEY;
                }
      
                phia = (phia + phib) /2.;  /* use the average of the 2 values */
                *rot = phia * 180. / pi;
            }
        }
    }

    /* get the type of projection, if any */
    tstat = 0;
    strcpy(keyname, "CTYPE1");
    strcat(keyname, alt);
    if (ffgkys(fptr, keyname, ctype, NULL, &tstat))
         type[0] = '\0';
    else
    {
        /* copy the projection type string */
        strncpy(type, &ctype[4], 4);
        type[4] = '\0';

        /* check if RA and DEC are inverted */
        if (!strncmp(ctype, "DEC-", 4) || !strncmp(ctype+1, "LAT", 3))
        {
            /* the latitudinal axis is given first, so swap them */

            *rot = 90. - (*rot);

            /* Empirical tests with ds9 show the y-axis sign must be negated */
            /* and the xinc and yinc values must NOT be swapped. */
            *yinc = -(*yinc);

            temp = *xrval;
            *xrval = *yrval;
            *yrval = temp;
        }   
    }

    return(*status);
}